

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  BCReg maxslot;
  BCReg BVar1;
  uint32_t uVar2;
  SnapShot *pSVar3;
  SnapEntry *pSVar4;
  uint uVar5;
  BCReg BVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint8_t auStack_138 [264];
  
  lVar11 = 0;
  if (cond != 0) {
    lVar11 = (ulong)(pc[1] >> 0x10) - 0x8000;
  }
  uVar5 = pc[1] >> 8 & 0xff;
  uVar7 = (ulong)(J->cur).nsnap;
  pSVar3 = (J->cur).snap;
  pSVar4 = (J->cur).snapmap;
  uVar12 = (uint)pSVar3[uVar7 - 1].nent + pSVar3[uVar7 - 1].mapofs;
  *(ulong *)(pSVar4 + uVar12) = (long)(pc + lVar11) * 0x100 + (ulong)(byte)pSVar4[uVar12] + 0x800;
  J->needsnap = '\x01';
  if (uVar5 < J->maxslot) {
    J->maxslot = uVar5;
    lj_snap_shrink(J);
    return;
  }
  pSVar3 = (J->cur).snap;
  uVar7 = (ulong)(J->cur).nsnap;
  uVar5 = pSVar3[uVar7 - 1].mapofs;
  pSVar4 = (J->cur).snapmap;
  uVar13 = (ulong)pSVar3[uVar7 - 1].nent;
  maxslot = J->maxslot;
  BVar1 = J->baseslot;
  BVar6 = snap_usedef(J,auStack_138,(BCIns *)(*(ulong *)(pSVar4 + uVar5 + uVar13) >> 8),maxslot);
  if (BVar6 < maxslot) {
    snap_useuv(J->pt,auStack_138);
  }
  pSVar3[uVar7 - 1].nslots = (uint8_t)(maxslot + BVar1);
  uVar12 = 0;
  for (uVar8 = 0; uVar13 != uVar8; uVar8 = uVar8 + 1) {
    uVar9 = pSVar4[uVar5 + uVar8] >> 0x18;
    if ((uVar9 < BVar6 + BVar1) ||
       ((uVar9 < maxslot + BVar1 && (auStack_138[uVar9 - BVar1] == '\0')))) {
      uVar10 = (ulong)uVar12;
      uVar12 = uVar12 + 1;
      pSVar4[uVar5 + uVar10] = pSVar4[uVar5 + uVar8];
    }
  }
  pSVar3[uVar7 - 1].nent = (uint8_t)uVar12;
  uVar9 = pSVar3[uVar7 - 1].mapofs;
  uVar2 = (J->cur).nsnapmap;
  for (; (uint)uVar13 <= ~uVar9 + uVar2; uVar13 = (ulong)((uint)uVar13 + 1)) {
    uVar8 = (ulong)uVar12;
    uVar12 = uVar12 + 1;
    pSVar4[uVar5 + uVar8] = pSVar4[uVar5 + uVar13];
  }
  (J->cur).nsnapmap = uVar12 + pSVar3[uVar7 - 1].mapofs;
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
#if LJ_FR2
  SnapEntry *flink = &J->cur.snapmap[snap->mapofs + snap->nent];
  uint64_t pcbase;
  memcpy(&pcbase, flink, sizeof(uint64_t));
  pcbase = (pcbase & 0xff) | (u64ptr(npc) << 8);
  memcpy(flink, &pcbase, sizeof(uint64_t));
#else
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
#endif
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}